

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double arcsin_sample(double a,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  dVar4 = arcsin_cdf_inv((double)iVar1 * 4.656612875e-10,a);
  return dVar4;
}

Assistant:

double arcsin_sample ( double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ARCSIN_SAMPLE samples the Arcsin PDF.
//
//  Modified:
//
//    20 March 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the CDF.
//    A must be positive.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double ARCSIN_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = arcsin_cdf_inv ( cdf, a );

  return x;
}